

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O3

void loadFunction(LoadState *S,Proto *f)

{
  TString *pTVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  lu_byte lVar26;
  byte bVar27;
  uint uVar28;
  size_t sVar29;
  Instruction *pIVar30;
  TValue *pTVar31;
  lu_byte *plVar32;
  Upvaldesc *pUVar33;
  Proto **ppPVar34;
  Proto *pPVar35;
  ls_byte *plVar36;
  AbsLineInfo *pAVar37;
  LocVar *pLVar38;
  LocVar *pLVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  int iVar54;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  long lVar55;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar79;
  undefined1 auVar77 [16];
  int iVar80;
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  int iVar94;
  int iVar98;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  lua_Integer paddingContent;
  undefined8 local_50;
  undefined1 local_48 [16];
  long lVar60;
  
  sVar29 = loadVarint(S,0x7fffffff);
  f->linedefined = (int)sVar29;
  sVar29 = loadVarint(S,0x7fffffff);
  f->lastlinedefined = (int)sVar29;
  lVar26 = loadByte(S);
  f->numparams = lVar26;
  bVar27 = loadByte(S);
  f->flag = bVar27 & 1;
  if (S->fixed != '\0') {
    f->flag = bVar27 & 1 | 2;
  }
  lVar26 = loadByte(S);
  f->maxstacksize = lVar26;
  sVar29 = loadVarint(S,0x7fffffff);
  uVar28 = (uint)S->offset & 3;
  if (uVar28 != 0) {
    loadBlock(S,&local_50,(ulong)(4 - uVar28));
  }
  iVar54 = (int)sVar29;
  if (S->fixed == '\0') {
    pIVar30 = (Instruction *)luaM_malloc_(S->L,(long)iVar54 << 2,0);
    f->code = pIVar30;
    f->sizecode = iVar54;
    loadBlock(S,pIVar30,(long)iVar54 << 2);
  }
  else {
    pIVar30 = (Instruction *)getaddr_(S,(long)iVar54 << 2);
    f->code = pIVar30;
    f->sizecode = iVar54;
  }
  sVar29 = loadVarint(S,0x7fffffff);
  uVar28 = (uint)sVar29;
  pTVar31 = (TValue *)luaM_malloc_(S->L,(long)(int)uVar28 << 4,0);
  f->k = pTVar31;
  f->sizek = uVar28;
  auVar25 = _DAT_0012cad0;
  if (0 < (int)uVar28) {
    uVar41 = (ulong)(uVar28 & 0x7fffffff);
    uVar42 = (ulong)(uVar28 + 0xf & 0xfffffff0);
    lVar40 = uVar41 - 1;
    local_48._8_4_ = (int)lVar40;
    local_48._0_8_ = lVar40;
    local_48._12_4_ = (int)((ulong)lVar40 >> 0x20);
    plVar32 = &pTVar31[0xf].tt_;
    auVar43 = local_48;
    auVar57 = _DAT_0012ca50;
    auVar61 = _DAT_0012ca60;
    auVar62 = _DAT_0012ca70;
    auVar63 = _DAT_0012ca80;
    auVar64 = _DAT_0012ca90;
    auVar65 = _DAT_0012caa0;
    auVar66 = _DAT_0012cab0;
    auVar67 = _DAT_0012cac0;
    do {
      auVar77 = local_48 ^ auVar25;
      auVar81 = auVar67 ^ auVar25;
      iVar54 = auVar77._0_4_;
      iVar94 = -(uint)(iVar54 < auVar81._0_4_);
      iVar56 = auVar77._4_4_;
      auVar83._4_4_ = -(uint)(iVar56 < auVar81._4_4_);
      iVar79 = auVar77._8_4_;
      iVar98 = -(uint)(iVar79 < auVar81._8_4_);
      iVar80 = auVar77._12_4_;
      auVar83._12_4_ = -(uint)(iVar80 < auVar81._12_4_);
      auVar77._4_4_ = iVar94;
      auVar77._0_4_ = iVar94;
      auVar77._8_4_ = iVar98;
      auVar77._12_4_ = iVar98;
      auVar77 = pshuflw(auVar43,auVar77,0xe8);
      auVar82._4_4_ = -(uint)(auVar81._4_4_ == iVar56);
      auVar82._12_4_ = -(uint)(auVar81._12_4_ == iVar80);
      auVar82._0_4_ = auVar82._4_4_;
      auVar82._8_4_ = auVar82._12_4_;
      auVar68 = pshuflw(in_XMM11,auVar82,0xe8);
      auVar83._0_4_ = auVar83._4_4_;
      auVar83._8_4_ = auVar83._12_4_;
      auVar81 = pshuflw(auVar77,auVar83,0xe8);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar43 = (auVar81 | auVar68 & auVar77) ^ auVar43;
      auVar43 = packssdw(auVar43,auVar43);
      if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar32[-0xf0] = 0;
      }
      auVar68._4_4_ = iVar94;
      auVar68._0_4_ = iVar94;
      auVar68._8_4_ = iVar98;
      auVar68._12_4_ = iVar98;
      auVar83 = auVar82 & auVar68 | auVar83;
      auVar43 = packssdw(auVar83,auVar83);
      auVar81._8_4_ = 0xffffffff;
      auVar81._0_8_ = 0xffffffffffffffff;
      auVar81._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 ^ auVar81,auVar43 ^ auVar81);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._0_4_ >> 8 & 1) != 0) {
        plVar32[-0xe0] = 0;
      }
      auVar43 = auVar66 ^ auVar25;
      auVar69._0_4_ = -(uint)(iVar54 < auVar43._0_4_);
      auVar69._4_4_ = -(uint)(iVar56 < auVar43._4_4_);
      auVar69._8_4_ = -(uint)(iVar79 < auVar43._8_4_);
      auVar69._12_4_ = -(uint)(iVar80 < auVar43._12_4_);
      auVar84._4_4_ = auVar69._0_4_;
      auVar84._0_4_ = auVar69._0_4_;
      auVar84._8_4_ = auVar69._8_4_;
      auVar84._12_4_ = auVar69._8_4_;
      iVar94 = -(uint)(auVar43._4_4_ == iVar56);
      iVar98 = -(uint)(auVar43._12_4_ == iVar80);
      auVar12._4_4_ = iVar94;
      auVar12._0_4_ = iVar94;
      auVar12._8_4_ = iVar98;
      auVar12._12_4_ = iVar98;
      auVar95._4_4_ = auVar69._4_4_;
      auVar95._0_4_ = auVar69._4_4_;
      auVar95._8_4_ = auVar69._12_4_;
      auVar95._12_4_ = auVar69._12_4_;
      auVar43 = auVar12 & auVar84 | auVar95;
      auVar43 = packssdw(auVar43,auVar43);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 ^ auVar3,auVar43 ^ auVar3);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._0_4_ >> 0x10 & 1) != 0) {
        plVar32[-0xd0] = 0;
      }
      auVar43 = pshufhw(auVar43,auVar84,0x84);
      auVar13._4_4_ = iVar94;
      auVar13._0_4_ = iVar94;
      auVar13._8_4_ = iVar98;
      auVar13._12_4_ = iVar98;
      auVar81 = pshufhw(auVar69,auVar13,0x84);
      auVar77 = pshufhw(auVar43,auVar95,0x84);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar77 | auVar81 & auVar43) ^ auVar44;
      auVar43 = packssdw(auVar44,auVar44);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._0_4_ >> 0x18 & 1) != 0) {
        plVar32[-0xc0] = 0;
      }
      auVar43 = auVar65 ^ auVar25;
      auVar70._0_4_ = -(uint)(iVar54 < auVar43._0_4_);
      auVar70._4_4_ = -(uint)(iVar56 < auVar43._4_4_);
      auVar70._8_4_ = -(uint)(iVar79 < auVar43._8_4_);
      auVar70._12_4_ = -(uint)(iVar80 < auVar43._12_4_);
      auVar14._4_4_ = auVar70._0_4_;
      auVar14._0_4_ = auVar70._0_4_;
      auVar14._8_4_ = auVar70._8_4_;
      auVar14._12_4_ = auVar70._8_4_;
      auVar81 = pshuflw(auVar95,auVar14,0xe8);
      auVar45._0_4_ = -(uint)(auVar43._0_4_ == iVar54);
      auVar45._4_4_ = -(uint)(auVar43._4_4_ == iVar56);
      auVar45._8_4_ = -(uint)(auVar43._8_4_ == iVar79);
      auVar45._12_4_ = -(uint)(auVar43._12_4_ == iVar80);
      auVar85._4_4_ = auVar45._4_4_;
      auVar85._0_4_ = auVar45._4_4_;
      auVar85._8_4_ = auVar45._12_4_;
      auVar85._12_4_ = auVar45._12_4_;
      auVar43 = pshuflw(auVar45,auVar85,0xe8);
      auVar86._4_4_ = auVar70._4_4_;
      auVar86._0_4_ = auVar70._4_4_;
      auVar86._8_4_ = auVar70._12_4_;
      auVar86._12_4_ = auVar70._12_4_;
      auVar77 = pshuflw(auVar70,auVar86,0xe8);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 & auVar81,(auVar77 | auVar43 & auVar81) ^ auVar4);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        plVar32[-0xb0] = 0;
      }
      auVar15._4_4_ = auVar70._0_4_;
      auVar15._0_4_ = auVar70._0_4_;
      auVar15._8_4_ = auVar70._8_4_;
      auVar15._12_4_ = auVar70._8_4_;
      auVar86 = auVar85 & auVar15 | auVar86;
      auVar77 = packssdw(auVar86,auVar86);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43,auVar77 ^ auVar5);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._4_2_ >> 8 & 1) != 0) {
        plVar32[-0xa0] = 0;
      }
      auVar43 = auVar64 ^ auVar25;
      auVar71._0_4_ = -(uint)(iVar54 < auVar43._0_4_);
      auVar71._4_4_ = -(uint)(iVar56 < auVar43._4_4_);
      auVar71._8_4_ = -(uint)(iVar79 < auVar43._8_4_);
      auVar71._12_4_ = -(uint)(iVar80 < auVar43._12_4_);
      auVar87._4_4_ = auVar71._0_4_;
      auVar87._0_4_ = auVar71._0_4_;
      auVar87._8_4_ = auVar71._8_4_;
      auVar87._12_4_ = auVar71._8_4_;
      iVar94 = -(uint)(auVar43._4_4_ == iVar56);
      iVar98 = -(uint)(auVar43._12_4_ == iVar80);
      auVar16._4_4_ = iVar94;
      auVar16._0_4_ = iVar94;
      auVar16._8_4_ = iVar98;
      auVar16._12_4_ = iVar98;
      auVar96._4_4_ = auVar71._4_4_;
      auVar96._0_4_ = auVar71._4_4_;
      auVar96._8_4_ = auVar71._12_4_;
      auVar96._12_4_ = auVar71._12_4_;
      auVar43 = auVar16 & auVar87 | auVar96;
      auVar43 = packssdw(auVar43,auVar43);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 ^ auVar6,auVar43 ^ auVar6);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        plVar32[-0x90] = 0;
      }
      auVar43 = pshufhw(auVar43,auVar87,0x84);
      auVar17._4_4_ = iVar94;
      auVar17._0_4_ = iVar94;
      auVar17._8_4_ = iVar98;
      auVar17._12_4_ = iVar98;
      auVar81 = pshufhw(auVar71,auVar17,0x84);
      auVar77 = pshufhw(auVar43,auVar96,0x84);
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar46 = (auVar77 | auVar81 & auVar43) ^ auVar46;
      auVar43 = packssdw(auVar46,auVar46);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._6_2_ >> 8 & 1) != 0) {
        plVar32[-0x80] = 0;
      }
      auVar43 = auVar63 ^ auVar25;
      auVar72._0_4_ = -(uint)(iVar54 < auVar43._0_4_);
      auVar72._4_4_ = -(uint)(iVar56 < auVar43._4_4_);
      auVar72._8_4_ = -(uint)(iVar79 < auVar43._8_4_);
      auVar72._12_4_ = -(uint)(iVar80 < auVar43._12_4_);
      auVar18._4_4_ = auVar72._0_4_;
      auVar18._0_4_ = auVar72._0_4_;
      auVar18._8_4_ = auVar72._8_4_;
      auVar18._12_4_ = auVar72._8_4_;
      auVar81 = pshuflw(auVar96,auVar18,0xe8);
      auVar47._0_4_ = -(uint)(auVar43._0_4_ == iVar54);
      auVar47._4_4_ = -(uint)(auVar43._4_4_ == iVar56);
      auVar47._8_4_ = -(uint)(auVar43._8_4_ == iVar79);
      auVar47._12_4_ = -(uint)(auVar43._12_4_ == iVar80);
      auVar88._4_4_ = auVar47._4_4_;
      auVar88._0_4_ = auVar47._4_4_;
      auVar88._8_4_ = auVar47._12_4_;
      auVar88._12_4_ = auVar47._12_4_;
      auVar43 = pshuflw(auVar47,auVar88,0xe8);
      auVar89._4_4_ = auVar72._4_4_;
      auVar89._0_4_ = auVar72._4_4_;
      auVar89._8_4_ = auVar72._12_4_;
      auVar89._12_4_ = auVar72._12_4_;
      auVar77 = pshuflw(auVar72,auVar89,0xe8);
      auVar73._8_4_ = 0xffffffff;
      auVar73._0_8_ = 0xffffffffffffffff;
      auVar73._12_4_ = 0xffffffff;
      auVar73 = (auVar77 | auVar43 & auVar81) ^ auVar73;
      auVar77 = packssdw(auVar73,auVar73);
      auVar43 = packsswb(auVar43 & auVar81,auVar77);
      if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar32[-0x70] = 0;
      }
      auVar19._4_4_ = auVar72._0_4_;
      auVar19._0_4_ = auVar72._0_4_;
      auVar19._8_4_ = auVar72._8_4_;
      auVar19._12_4_ = auVar72._8_4_;
      auVar89 = auVar88 & auVar19 | auVar89;
      auVar77 = packssdw(auVar89,auVar89);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar77 = packssdw(auVar77 ^ auVar7,auVar77 ^ auVar7);
      auVar43 = packsswb(auVar43,auVar77);
      if ((auVar43._8_2_ >> 8 & 1) != 0) {
        plVar32[-0x60] = 0;
      }
      auVar43 = auVar62 ^ auVar25;
      auVar74._0_4_ = -(uint)(iVar54 < auVar43._0_4_);
      auVar74._4_4_ = -(uint)(iVar56 < auVar43._4_4_);
      auVar74._8_4_ = -(uint)(iVar79 < auVar43._8_4_);
      auVar74._12_4_ = -(uint)(iVar80 < auVar43._12_4_);
      auVar90._4_4_ = auVar74._0_4_;
      auVar90._0_4_ = auVar74._0_4_;
      auVar90._8_4_ = auVar74._8_4_;
      auVar90._12_4_ = auVar74._8_4_;
      iVar94 = -(uint)(auVar43._4_4_ == iVar56);
      iVar98 = -(uint)(auVar43._12_4_ == iVar80);
      auVar20._4_4_ = iVar94;
      auVar20._0_4_ = iVar94;
      auVar20._8_4_ = iVar98;
      auVar20._12_4_ = iVar98;
      auVar97._4_4_ = auVar74._4_4_;
      auVar97._0_4_ = auVar74._4_4_;
      auVar97._8_4_ = auVar74._12_4_;
      auVar97._12_4_ = auVar74._12_4_;
      auVar43 = auVar20 & auVar90 | auVar97;
      auVar43 = packssdw(auVar43,auVar43);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 ^ auVar8,auVar43 ^ auVar8);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        plVar32[-0x50] = 0;
      }
      auVar43 = pshufhw(auVar43,auVar90,0x84);
      auVar21._4_4_ = iVar94;
      auVar21._0_4_ = iVar94;
      auVar21._8_4_ = iVar98;
      auVar21._12_4_ = iVar98;
      auVar81 = pshufhw(auVar74,auVar21,0x84);
      auVar77 = pshufhw(auVar43,auVar97,0x84);
      auVar48._8_4_ = 0xffffffff;
      auVar48._0_8_ = 0xffffffffffffffff;
      auVar48._12_4_ = 0xffffffff;
      auVar48 = (auVar77 | auVar81 & auVar43) ^ auVar48;
      auVar43 = packssdw(auVar48,auVar48);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._10_2_ >> 8 & 1) != 0) {
        plVar32[-0x40] = 0;
      }
      auVar43 = auVar61 ^ auVar25;
      auVar75._0_4_ = -(uint)(iVar54 < auVar43._0_4_);
      auVar75._4_4_ = -(uint)(iVar56 < auVar43._4_4_);
      auVar75._8_4_ = -(uint)(iVar79 < auVar43._8_4_);
      auVar75._12_4_ = -(uint)(iVar80 < auVar43._12_4_);
      auVar22._4_4_ = auVar75._0_4_;
      auVar22._0_4_ = auVar75._0_4_;
      auVar22._8_4_ = auVar75._8_4_;
      auVar22._12_4_ = auVar75._8_4_;
      auVar81 = pshuflw(auVar97,auVar22,0xe8);
      auVar49._0_4_ = -(uint)(auVar43._0_4_ == iVar54);
      auVar49._4_4_ = -(uint)(auVar43._4_4_ == iVar56);
      auVar49._8_4_ = -(uint)(auVar43._8_4_ == iVar79);
      auVar49._12_4_ = -(uint)(auVar43._12_4_ == iVar80);
      auVar91._4_4_ = auVar49._4_4_;
      auVar91._0_4_ = auVar49._4_4_;
      auVar91._8_4_ = auVar49._12_4_;
      auVar91._12_4_ = auVar49._12_4_;
      auVar43 = pshuflw(auVar49,auVar91,0xe8);
      auVar92._4_4_ = auVar75._4_4_;
      auVar92._0_4_ = auVar75._4_4_;
      auVar92._8_4_ = auVar75._12_4_;
      auVar92._12_4_ = auVar75._12_4_;
      auVar77 = pshuflw(auVar75,auVar92,0xe8);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 & auVar81,(auVar77 | auVar43 & auVar81) ^ auVar9);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        plVar32[-0x30] = 0;
      }
      auVar23._4_4_ = auVar75._0_4_;
      auVar23._0_4_ = auVar75._0_4_;
      auVar23._8_4_ = auVar75._8_4_;
      auVar23._12_4_ = auVar75._8_4_;
      auVar92 = auVar91 & auVar23 | auVar92;
      auVar77 = packssdw(auVar92,auVar92);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43,auVar77 ^ auVar10);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._12_2_ >> 8 & 1) != 0) {
        plVar32[-0x20] = 0;
      }
      auVar43 = auVar57 ^ auVar25;
      auVar76._0_4_ = -(uint)(iVar54 < auVar43._0_4_);
      auVar76._4_4_ = -(uint)(iVar56 < auVar43._4_4_);
      auVar76._8_4_ = -(uint)(iVar79 < auVar43._8_4_);
      auVar76._12_4_ = -(uint)(iVar80 < auVar43._12_4_);
      auVar93._4_4_ = auVar76._0_4_;
      auVar93._0_4_ = auVar76._0_4_;
      auVar93._8_4_ = auVar76._8_4_;
      auVar93._12_4_ = auVar76._8_4_;
      iVar54 = -(uint)(auVar43._4_4_ == iVar56);
      iVar56 = -(uint)(auVar43._12_4_ == iVar80);
      auVar78._4_4_ = iVar54;
      auVar78._0_4_ = iVar54;
      auVar78._8_4_ = iVar56;
      auVar78._12_4_ = iVar56;
      auVar50._4_4_ = auVar76._4_4_;
      auVar50._0_4_ = auVar76._4_4_;
      auVar50._8_4_ = auVar76._12_4_;
      auVar50._12_4_ = auVar76._12_4_;
      auVar50 = auVar78 & auVar93 | auVar50;
      auVar43 = packssdw(auVar50,auVar50);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 ^ auVar11,auVar43 ^ auVar11);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        plVar32[-0x10] = 0;
      }
      auVar43 = pshufhw(auVar43,auVar93,0x84);
      in_XMM11 = pshufhw(auVar76,auVar78,0x84);
      in_XMM11 = in_XMM11 & auVar43;
      auVar24._4_4_ = auVar76._4_4_;
      auVar24._0_4_ = auVar76._4_4_;
      auVar24._8_4_ = auVar76._12_4_;
      auVar24._12_4_ = auVar76._12_4_;
      auVar43 = pshufhw(auVar43,auVar24,0x84);
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      auVar51 = (auVar43 | in_XMM11) ^ auVar51;
      auVar43 = packssdw(auVar51,auVar51);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._14_2_ >> 8 & 1) != 0) {
        *plVar32 = '\0';
      }
      lVar40 = (long)DAT_0012daa0;
      lVar60 = auVar67._8_8_;
      auVar67._0_8_ = auVar67._0_8_ + lVar40;
      lVar55 = DAT_0012daa0._8_8_;
      auVar67._8_8_ = lVar60 + lVar55;
      lVar60 = auVar66._8_8_;
      auVar66._0_8_ = auVar66._0_8_ + lVar40;
      auVar66._8_8_ = lVar60 + lVar55;
      lVar60 = auVar65._8_8_;
      auVar65._0_8_ = auVar65._0_8_ + lVar40;
      auVar65._8_8_ = lVar60 + lVar55;
      lVar60 = auVar64._8_8_;
      auVar64._0_8_ = auVar64._0_8_ + lVar40;
      auVar64._8_8_ = lVar60 + lVar55;
      lVar60 = auVar63._8_8_;
      auVar63._0_8_ = auVar63._0_8_ + lVar40;
      auVar63._8_8_ = lVar60 + lVar55;
      lVar60 = auVar62._8_8_;
      auVar62._0_8_ = auVar62._0_8_ + lVar40;
      auVar62._8_8_ = lVar60 + lVar55;
      lVar60 = auVar61._8_8_;
      auVar61._0_8_ = auVar61._0_8_ + lVar40;
      auVar61._8_8_ = lVar60 + lVar55;
      lVar60 = auVar57._8_8_;
      auVar57._0_8_ = auVar57._0_8_ + lVar40;
      auVar57._8_8_ = lVar60 + lVar55;
      plVar32 = plVar32 + 0x100;
      uVar42 = uVar42 - 0x10;
      auVar43 = _DAT_0012daa0;
    } while (uVar42 != 0);
    lVar40 = 8;
    do {
      pTVar31 = f->k;
      bVar27 = loadByte(S);
      if (bVar27 < 0x11) {
        switch(bVar27) {
        case 0:
          *(undefined1 *)((long)&pTVar31->value_ + lVar40) = 0;
          break;
        case 1:
          *(undefined1 *)((long)&pTVar31->value_ + lVar40) = 1;
          break;
        case 3:
          loadBlock(S,&local_50,8);
          *(undefined8 *)((long)pTVar31 + lVar40 + -8) = local_50;
          *(undefined1 *)((long)&pTVar31->value_ + lVar40) = 3;
          break;
        case 4:
switchD_0011f247_caseD_4:
          loadString(S,f,&f->source);
          pTVar1 = f->source;
          if (pTVar1 == (TString *)0x0) {
            error(S,"bad format for constant string");
          }
          *(TString **)((long)pTVar31 + lVar40 + -8) = pTVar1;
          *(byte *)((long)&pTVar31->value_ + lVar40) = pTVar1->tt | 0x40;
          f->source = (TString *)0x0;
        }
      }
      else if (bVar27 == 0x11) {
        *(undefined1 *)((long)&pTVar31->value_ + lVar40) = 0x11;
      }
      else if (bVar27 == 0x13) {
        loadBlock(S,&local_50,8);
        *(undefined8 *)((long)pTVar31 + lVar40 + -8) = local_50;
        *(undefined1 *)((long)&pTVar31->value_ + lVar40) = 0x13;
      }
      else if (bVar27 == 0x14) goto switchD_0011f247_caseD_4;
      lVar40 = lVar40 + 0x10;
      uVar41 = uVar41 - 1;
    } while (uVar41 != 0);
  }
  sVar29 = loadVarint(S,0x7fffffff);
  uVar28 = (uint)sVar29;
  pUVar33 = (Upvaldesc *)luaM_malloc_(S->L,(long)(int)uVar28 << 4,0);
  f->upvalues = pUVar33;
  f->sizeupvalues = uVar28;
  auVar25 = _DAT_0012cad0;
  if (0 < (int)uVar28) {
    uVar41 = (ulong)(uVar28 & 0x7fffffff);
    uVar42 = (ulong)(uVar28 + 1 & 0xfffffffe);
    lVar40 = uVar41 - 1;
    auVar52._8_4_ = (int)lVar40;
    auVar52._0_8_ = lVar40;
    auVar52._12_4_ = (int)((ulong)lVar40 >> 0x20);
    pUVar33 = pUVar33 + 1;
    auVar52 = auVar52 ^ _DAT_0012cad0;
    auVar58 = _DAT_0012cac0;
    do {
      bVar2 = auVar52._0_4_ < SUB164(auVar58 ^ auVar25,0);
      iVar54 = auVar52._4_4_;
      iVar56 = SUB164(auVar58 ^ auVar25,4);
      if ((bool)(~(iVar54 < iVar56 || iVar56 == iVar54 && bVar2) & 1)) {
        pUVar33[-1].name = (TString *)0x0;
      }
      if (iVar54 >= iVar56 && (iVar56 != iVar54 || !bVar2)) {
        pUVar33->name = (TString *)0x0;
      }
      lVar40 = auVar58._8_8_;
      auVar58._0_8_ = auVar58._0_8_ + 2;
      auVar58._8_8_ = lVar40 + 2;
      pUVar33 = pUVar33 + 2;
      uVar42 = uVar42 - 2;
    } while (uVar42 != 0);
    lVar40 = 0;
    do {
      lVar26 = loadByte(S);
      (&f->upvalues->instack)[lVar40] = lVar26;
      lVar26 = loadByte(S);
      (&f->upvalues->idx)[lVar40] = lVar26;
      lVar26 = loadByte(S);
      (&f->upvalues->kind)[lVar40] = lVar26;
      lVar40 = lVar40 + 0x10;
      uVar41 = uVar41 - 1;
    } while (uVar41 != 0);
  }
  sVar29 = loadVarint(S,0x7fffffff);
  uVar28 = (uint)sVar29;
  ppPVar34 = (Proto **)luaM_malloc_(S->L,(long)(int)uVar28 * 8,0);
  f->p = ppPVar34;
  f->sizep = uVar28;
  if (0 < (int)uVar28) {
    uVar41 = 0;
    do {
      f->p[uVar41] = (Proto *)0x0;
      uVar41 = uVar41 + 1;
    } while ((uVar28 & 0x7fffffff) != uVar41);
    if (0 < (int)uVar28) {
      uVar41 = 0;
      do {
        pPVar35 = luaF_newproto(S->L);
        f->p[uVar41] = pPVar35;
        ppPVar34 = f->p;
        if (((f->marked & 0x20) != 0) && ((ppPVar34[uVar41]->marked & 0x18) != 0)) {
          luaC_barrier_(S->L,(GCObject *)f,(GCObject *)ppPVar34[uVar41]);
          ppPVar34 = f->p;
        }
        loadFunction(S,ppPVar34[uVar41]);
        uVar41 = uVar41 + 1;
      } while ((uVar28 & 0x7fffffff) != uVar41);
    }
  }
  loadString(S,f,&f->source);
  sVar29 = loadVarint(S,0x7fffffff);
  iVar54 = (int)sVar29;
  if (S->fixed == '\0') {
    plVar36 = (ls_byte *)luaM_malloc_(S->L,(long)iVar54,0);
    f->lineinfo = plVar36;
    f->sizelineinfo = iVar54;
    loadBlock(S,plVar36,(long)iVar54);
  }
  else {
    plVar36 = (ls_byte *)getaddr_(S,(long)iVar54);
    f->lineinfo = plVar36;
    f->sizelineinfo = iVar54;
  }
  sVar29 = loadVarint(S,0x7fffffff);
  iVar54 = (int)sVar29;
  if (0 < iVar54) {
    uVar28 = (uint)S->offset & 3;
    if (uVar28 != 0) {
      loadBlock(S,&local_50,(ulong)(4 - uVar28));
    }
    if (S->fixed == '\0') {
      sVar29 = (sVar29 & 0x7fffffff) << 3;
      pAVar37 = (AbsLineInfo *)luaM_malloc_(S->L,sVar29,0);
      f->abslineinfo = pAVar37;
      f->sizeabslineinfo = iVar54;
      loadBlock(S,pAVar37,sVar29);
    }
    else {
      pAVar37 = (AbsLineInfo *)getaddr_(S,(sVar29 & 0x7fffffff) << 3);
      f->abslineinfo = pAVar37;
      f->sizeabslineinfo = iVar54;
    }
  }
  sVar29 = loadVarint(S,0x7fffffff);
  uVar28 = (uint)sVar29;
  pLVar38 = (LocVar *)luaM_malloc_(S->L,(long)(int)uVar28 << 4,0);
  f->locvars = pLVar38;
  f->sizelocvars = uVar28;
  auVar25 = _DAT_0012cad0;
  if (0 < (int)uVar28) {
    uVar41 = (ulong)(uVar28 & 0x7fffffff);
    uVar42 = (ulong)(uVar28 + 1 & 0xfffffffe);
    lVar40 = uVar41 - 1;
    auVar53._8_4_ = (int)lVar40;
    auVar53._0_8_ = lVar40;
    auVar53._12_4_ = (int)((ulong)lVar40 >> 0x20);
    pLVar39 = pLVar38 + 1;
    auVar53 = auVar53 ^ _DAT_0012cad0;
    auVar59 = _DAT_0012cac0;
    do {
      auVar43 = auVar59 ^ auVar25;
      if ((bool)(~(auVar43._4_4_ == auVar53._4_4_ && auVar53._0_4_ < auVar43._0_4_ ||
                  auVar53._4_4_ < auVar43._4_4_) & 1)) {
        pLVar39[-1].varname = (TString *)0x0;
      }
      if ((auVar43._12_4_ != auVar53._12_4_ || auVar43._8_4_ <= auVar53._8_4_) &&
          auVar43._12_4_ <= auVar53._12_4_) {
        pLVar39->varname = (TString *)0x0;
      }
      lVar40 = auVar59._8_8_;
      auVar59._0_8_ = auVar59._0_8_ + 2;
      auVar59._8_8_ = lVar40 + 2;
      pLVar39 = pLVar39 + 2;
      uVar42 = uVar42 - 2;
    } while (uVar42 != 0);
    lVar40 = 0;
    do {
      loadString(S,f,(TString **)((long)&pLVar38->varname + lVar40));
      sVar29 = loadVarint(S,0x7fffffff);
      *(int *)((long)&f->locvars->startpc + lVar40) = (int)sVar29;
      sVar29 = loadVarint(S,0x7fffffff);
      pLVar38 = f->locvars;
      *(int *)((long)&pLVar38->endpc + lVar40) = (int)sVar29;
      lVar40 = lVar40 + 0x10;
      uVar41 = uVar41 - 1;
    } while (uVar41 != 0);
  }
  sVar29 = loadVarint(S,0x7fffffff);
  if (((int)sVar29 != 0) && (iVar54 = f->sizeupvalues, 0 < (long)iVar54)) {
    lVar40 = 0;
    do {
      loadString(S,f,(TString **)((long)&f->upvalues->name + lVar40));
      lVar40 = lVar40 + 0x10;
    } while ((long)iVar54 * 0x10 != lVar40);
  }
  return;
}

Assistant:

static void loadFunction (LoadState *S, Proto *f) {
  f->linedefined = loadInt(S);
  f->lastlinedefined = loadInt(S);
  f->numparams = loadByte(S);
  f->flag = loadByte(S) & PF_ISVARARG;  /* get only the meaningful flags */
  if (S->fixed)
    f->flag |= PF_FIXED;  /* signal that code is fixed */
  f->maxstacksize = loadByte(S);
  loadCode(S, f);
  loadConstants(S, f);
  loadUpvalues(S, f);
  loadProtos(S, f);
  loadString(S, f, &f->source);
  loadDebug(S, f);
}